

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O3

JavascriptArray *
Js::JavascriptObject::CreateKeysHelper
          (RecyclableObject *object,ScriptContext *scriptContext,BOOL includeNonEnumerable,
          bool includeSymbolProperties,bool includeStringProperties,bool includeSpecialProperties)

{
  Type TVar1;
  code *pcVar2;
  ScriptContext *pSVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  undefined4 *puVar8;
  JavascriptArray *this;
  EnumeratorCache *pEVar9;
  JavascriptString *pJVar10;
  PropertyRecord *propertyRecord;
  Var newValue;
  JavascriptSymbol *newValue_00;
  JavascriptArray *this_00;
  SparseArraySegmentBase *pSVar11;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  uint32 uVar12;
  uint32 offset;
  ulong uVar13;
  undefined4 uVar14;
  uint uVar15;
  undefined1 auStack_d8 [8];
  JavascriptStaticEnumerator enumerator;
  JavascriptString *local_58;
  ulong local_50;
  PropertyId local_44;
  ScriptContext *pSStack_40;
  PropertyId propertyId;
  JavascriptArray *local_38;
  
  pSStack_40 = scriptContext;
  if (!includeSymbolProperties && !includeStringProperties) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x4cc,"(includeStringProperties || includeSymbolProperties)",
                                "Should either get string or symbol properties.");
    if (!bVar4) {
LAB_00ce30e8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  auStack_d8 = (undefined1  [8])0x0;
  enumerator.propertyEnumerator.scriptContext.ptr = (ScriptContext *)0x0;
  enumerator.propertyEnumerator.object.ptr = (DynamicObject *)0x0;
  enumerator.propertyEnumerator.enumeratedCount = 0;
  enumerator.propertyEnumerator.flags = None;
  enumerator.propertyEnumerator._37_3_ = 0;
  enumerator.propertyEnumerator.cachedData.ptr = (CachedData *)0x0;
  enumerator.currentEnumerator.ptr = (JavascriptEnumerator *)0x0;
  enumerator.prefixEnumerator.ptr = (JavascriptEnumerator *)0x0;
  uVar13 = 0;
  JavascriptStaticEnumerator::Clear
            ((JavascriptStaticEnumerator *)auStack_d8,None,(ScriptContext *)0x0);
  pSVar3 = pSStack_40;
  this = JavascriptLibrary::CreateArray((pSStack_40->super_ScriptContextBase).javascriptLibrary,0);
  bVar5 = includeNonEnumerable == 0 ^ 0xd;
  local_50 = CONCAT44(local_50._4_4_,(int)CONCAT71(in_register_00000009,includeSymbolProperties));
  bVar6 = bVar5 | 2;
  if (!includeSymbolProperties) {
    bVar6 = bVar5;
  }
  pEVar9 = JavascriptLibrary::GetCreateKeysCache
                     ((pSVar3->super_ScriptContextBase).javascriptLibrary,(object->type).ptr);
  iVar7 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x2b])(object,auStack_d8,(ulong)bVar6,pSVar3,pEVar9);
  if (iVar7 != 0) {
    pJVar10 = JavascriptStaticEnumerator::MoveAndGetNext
                        ((JavascriptStaticEnumerator *)auStack_d8,&local_44,
                         (PropertyAttributes *)0x0);
    local_38 = (JavascriptArray *)0x0;
    local_58 = pJVar10;
    if (pJVar10 != (JavascriptString *)0x0) {
      local_38 = (JavascriptArray *)0x0;
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar13 = 0;
      uVar15 = 0;
      do {
        uVar14 = (undefined4)local_50;
        while (((char)uVar14 == '\0' ||
               (propertyRecord = ScriptContext::GetPropertyName(pSStack_40,local_44),
               propertyRecord->isSymbol != true))) {
          if (includeStringProperties) {
            newValue = CrossSite::MarshalVar
                                 (pSStack_40,pJVar10,
                                  (((((pJVar10->super_RecyclableObject).type.ptr)->javascriptLibrary
                                    ).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
            JavascriptArray::DirectSetItemAt<void*>(this,(uint32)uVar13,newValue);
            uVar13 = (ulong)((uint32)uVar13 + 1);
            uVar14 = (undefined4)local_50;
          }
          pJVar10 = JavascriptStaticEnumerator::MoveAndGetNext
                              ((JavascriptStaticEnumerator *)auStack_d8,&local_44,
                               (PropertyAttributes *)0x0);
          local_58 = pJVar10;
          if (pJVar10 == (JavascriptString *)0x0) goto LAB_00ce2f83;
        }
        newValue_00 = ScriptContext::GetSymbol(pSStack_40,propertyRecord);
        this_00 = local_38;
        if (local_38 == (JavascriptArray *)0x0) {
          this_00 = JavascriptLibrary::CreateArray
                              ((pSStack_40->super_ScriptContextBase).javascriptLibrary,0);
        }
        if (uVar15 + 1 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.inl"
                                      ,0x1d5,"(itemIndex < InvalidIndex)","itemIndex < InvalidIndex"
                                     );
          if (!bVar4) goto LAB_00ce30e8;
          *puVar8 = 0;
        }
        local_38 = this_00;
        pSVar11 = JavascriptArray::GetLastUsedSegment(this_00);
        uVar12 = uVar15 - pSVar11->left;
        if ((uVar15 < pSVar11->left) || (pSVar11->size <= uVar12)) {
          JavascriptArray::DirectSetItem_Full<Js::JavascriptSymbol*>(local_38,uVar15,newValue_00);
        }
        else {
          JavascriptArray::DirectSetItemInLastUsedSegmentAt<Js::JavascriptSymbol*>
                    (local_38,uVar12,newValue_00);
        }
        pJVar10 = JavascriptStaticEnumerator::MoveAndGetNext
                            ((JavascriptStaticEnumerator *)auStack_d8,&local_44,
                             (PropertyAttributes *)0x0);
        uVar15 = uVar15 + 1;
        local_58 = pJVar10;
      } while (pJVar10 != (JavascriptString *)0x0);
    }
LAB_00ce2f83:
    if (includeStringProperties && includeSpecialProperties) {
      uVar15 = 0;
      iVar7 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x3f])(object,0,&local_58,pSStack_40);
      if (iVar7 != 0) {
        local_50 = uVar13;
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          pJVar10 = local_58;
          uVar12 = (int)local_50 + uVar15;
          if (uVar12 == 0xffffffff) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.inl"
                                        ,0x1d5,"(itemIndex < InvalidIndex)",
                                        "itemIndex < InvalidIndex");
            if (!bVar4) goto LAB_00ce30e8;
            *puVar8 = 0;
          }
          pSVar11 = JavascriptArray::GetLastUsedSegment(this);
          if ((uVar12 < pSVar11->left) || (offset = uVar12 - pSVar11->left, pSVar11->size <= offset)
             ) {
            JavascriptArray::DirectSetItem_Full<Js::JavascriptString*>(this,uVar12,pJVar10);
          }
          else {
            JavascriptArray::DirectSetItemInLastUsedSegmentAt<Js::JavascriptString*>
                      (this,offset,pJVar10);
          }
          uVar15 = uVar15 + 1;
          iVar7 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x3f])(object,(ulong)uVar15,&local_58,pSStack_40);
        } while (iVar7 != 0);
        uVar13 = (ulong)((int)local_50 + uVar15);
      }
    }
    if ((local_38 != (JavascriptArray *)0x0) &&
       (TVar1 = (local_38->super_ArrayObject).length, TVar1 != 0)) {
      uVar15 = 0;
      do {
        iVar7 = (*(local_38->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x72])(local_38,(ulong)uVar15);
        JavascriptArray::DirectSetItemAt<void*>
                  (this,(int)uVar13 + uVar15,(Var)CONCAT44(extraout_var,iVar7));
        uVar15 = uVar15 + 1;
      } while (TVar1 != uVar15);
    }
  }
  return this;
}

Assistant:

JavascriptArray* JavascriptObject::CreateKeysHelper(RecyclableObject* object, ScriptContext* scriptContext, BOOL includeNonEnumerable, bool includeSymbolProperties, bool includeStringProperties, bool includeSpecialProperties)
{
    //1. Let keys be a new empty List.
    //2. For each own property key P of O that is an integer index, in ascending numeric index order
    //      a. Add P as the last element of keys.
    //3. For each own property key P of O that is a String but is not an integer index, in property creation order
    //      a. Add P as the last element of keys.
    //4. For each own property key P of O that is a Symbol, in property creation order
    //      a. Add P as the last element of keys.
    //5. Return keys.
    AssertMsg(includeStringProperties || includeSymbolProperties, "Should either get string or symbol properties.");

    JavascriptStaticEnumerator enumerator;
    EnumeratorFlags flags = EnumeratorFlags::SnapShotSemantics | EnumeratorFlags::UseCache;
    JavascriptArray* newArr = scriptContext->GetLibrary()->CreateArray(0);
    if (includeNonEnumerable)
    {
        flags |= EnumeratorFlags::EnumNonEnumerable;
    }
    if (includeSymbolProperties)
    {
        flags |= EnumeratorFlags::EnumSymbols;
    }
    EnumeratorCache* cache = scriptContext->GetLibrary()->GetCreateKeysCache(object->GetType());
    if (!object->GetEnumerator(&enumerator, flags, scriptContext, cache))
    {
        return newArr;  // Return an empty array if we don't have an enumerator
    }

    JavascriptString * propertyName = nullptr;
    PropertyId propertyId;
    uint32 propertyIndex = 0;
    uint32 symbolIndex = 0;
    const PropertyRecord* propertyRecord;
    JavascriptSymbol* symbol;
    JavascriptArray* newArrForSymbols = nullptr;
    while ((propertyName = enumerator.MoveAndGetNext(propertyId)) != NULL)
    {
        if (propertyName)
        {
            if (includeSymbolProperties)
            {
                propertyRecord = scriptContext->GetPropertyName(propertyId);

                if (propertyRecord->IsSymbol())
                {
                    symbol = scriptContext->GetSymbol(propertyRecord);
                    // no need to marshal symbol because it is created from scriptContext
                    if (!newArrForSymbols)
                    {
                        newArrForSymbols = scriptContext->GetLibrary()->CreateArray(0);
                    }
                    newArrForSymbols->DirectSetItemAt(symbolIndex++, symbol);
                    continue;
                }
            }
            if (includeStringProperties)
            {
                newArr->DirectSetItemAt(propertyIndex++, CrossSite::MarshalVar(scriptContext, propertyName, propertyName->GetScriptContext()));
            }
        }
    }

    // Special properties
    if (includeSpecialProperties && includeStringProperties)
    {
        uint32 index = 0;
        while (object->GetSpecialPropertyName(index, &propertyName, scriptContext))
        {
            newArr->DirectSetItemAt(propertyIndex++, propertyName);
            index++;
        }
    }

    if (newArrForSymbols)
    {
        // Append all the symbols at the end of list
        uint32 totalSymbols = newArrForSymbols->GetLength();
        for (uint32 symIndex = 0; symIndex < totalSymbols; symIndex++)
        {
            newArr->DirectSetItemAt(propertyIndex++, newArrForSymbols->DirectGetItem(symIndex));
        }
    }

    return newArr;
}